

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O1

void __thiscall wasm::CodeFolding::visitReturn(CodeFolding *this,Return *curr)

{
  pointer *ppTVar1;
  size_t sVar2;
  iterator __position;
  Expression **ppEVar3;
  Tail local_30;
  
  local_30.expr = (Expression *)curr;
  if (((long)*(pointer *)
              ((long)&(this->
                      super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                      ).
                      super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                      .controlFlowStack.flexible.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data + 8) -
       (long)(this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
             ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
             controlFlowStack.flexible.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) +
      (this->
      super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
      ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
      controlFlowStack.usedFixed != 0) {
    ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .controlFlowStack);
    local_30.block = (Block *)*ppEVar3;
    if (((local_30.block)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id
        == BlockId) {
      sVar2 = ((local_30.block)->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      if (sVar2 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      if ((Return *)
          ((local_30.block)->list).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[sVar2 - 1]
          == curr) {
        local_30.pointer = (Expression **)0x0;
        Tail::validate(&local_30);
        goto LAB_006a5420;
      }
    }
  }
  local_30.pointer =
       (this->
       super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
       ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
       super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
       super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.replacep;
  local_30.block = (Block *)0x0;
LAB_006a5420:
  __position._M_current =
       (this->returnTails).
       super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->returnTails).
      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
    _M_realloc_insert<wasm::CodeFolding::Tail>(&this->returnTails,__position,&local_30);
  }
  else {
    (__position._M_current)->pointer = local_30.pointer;
    (__position._M_current)->expr = local_30.expr;
    (__position._M_current)->block = local_30.block;
    ppTVar1 = &(this->returnTails).
               super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return;
}

Assistant:

void visitReturn(Return* curr) {
    if (!controlFlowStack.empty()) {
      // we can easily optimize if we are at the end of the parent block
      Block* parent = controlFlowStack.back()->dynCast<Block>();
      if (parent && curr == parent->list.back()) {
        returnTails.push_back(Tail(curr, parent));
        return;
      }
    }
    // otherwise, if we have a large value, it might be worth optimizing us as
    // well
    returnTails.push_back(Tail(curr, getCurrentPointer()));
  }